

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton10.cpp
# Opt level: O1

void __thiscall CDReporter<ComponentA>::~CDReporter(CDReporter<ComponentA> *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"destructor: ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"CDReporter<ComponentA>::~CDReporter() [T = ComponentA]",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," this: ",7);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

~CDReporter() { std::cout << "destructor: " << __PRETTY_FUNCTION__ << " this: " << (void*)this << std::endl; }